

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_catalog_entry.cpp
# Opt level: O2

int64_t __thiscall
duckdb::SequenceCatalogEntry::NextValue(SequenceCatalogEntry *this,DuckTransaction *transaction)

{
  int64_t *result;
  int64_t left;
  long lVar1;
  long lVar2;
  bool bVar3;
  SequenceException *pSVar4;
  long lVar5;
  allocator local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::mutex::lock(&this->lock);
  result = &(this->data).counter;
  left = (this->data).counter;
  bVar3 = TryAddOperator::Operation<long,long,long>(left,(this->data).increment,result);
  if ((this->data).cycle == true) {
    if (bVar3) {
      lVar1 = (this->data).counter;
      lVar2 = (this->data).min_value;
      lVar5 = (this->data).max_value;
      if ((lVar2 <= lVar1) && (bVar3 = lVar1 <= lVar5, lVar5 = lVar2, bVar3)) goto LAB_008acb90;
    }
    else {
      lVar5 = *(long *)((long)this + ((this->data).increment >> 0x3f) * -8 + 0x170);
    }
    *result = lVar5;
  }
  else {
    if ((left < (this->data).min_value) || ((this->data).increment < 0 && !bVar3)) {
      pSVar4 = (SequenceException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_90,"nextval: reached minimum value of sequence \"%s\" (%lld)",
                 &local_91);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)&(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name
                );
      SequenceException::SequenceException<std::__cxx11::string,long>
                (pSVar4,&local_90,&local_50,(this->data).min_value);
      __cxa_throw(pSVar4,&SequenceException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (!bVar3 || (this->data).max_value < left) {
      pSVar4 = (SequenceException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_90,"nextval: reached maximum value of sequence \"%s\" (%lld)",
                 &local_91);
      ::std::__cxx11::string::string
                ((string *)&local_70,
                 (string *)&(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name
                );
      SequenceException::SequenceException<std::__cxx11::string,long>
                (pSVar4,&local_90,&local_70,(this->data).max_value);
      __cxa_throw(pSVar4,&SequenceException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
LAB_008acb90:
  (this->data).last_value = left;
  (this->data).usage_count = (this->data).usage_count + 1;
  if ((this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.temporary == false) {
    DuckTransaction::PushSequenceUsage(transaction,this,&this->data);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return left;
}

Assistant:

int64_t SequenceCatalogEntry::NextValue(DuckTransaction &transaction) {
	lock_guard<mutex> seqlock(lock);
	int64_t result;
	result = data.counter;
	bool overflow = !TryAddOperator::Operation(data.counter, data.increment, data.counter);
	if (data.cycle) {
		if (overflow) {
			data.counter = data.increment < 0 ? data.max_value : data.min_value;
		} else if (data.counter < data.min_value) {
			data.counter = data.max_value;
		} else if (data.counter > data.max_value) {
			data.counter = data.min_value;
		}
	} else {
		if (result < data.min_value || (overflow && data.increment < 0)) {
			throw SequenceException("nextval: reached minimum value of sequence \"%s\" (%lld)", name, data.min_value);
		}
		if (result > data.max_value || overflow) {
			throw SequenceException("nextval: reached maximum value of sequence \"%s\" (%lld)", name, data.max_value);
		}
	}
	data.last_value = result;
	data.usage_count++;
	if (!temporary) {
		transaction.PushSequenceUsage(*this, data);
	}
	return result;
}